

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satProof2.h
# Opt level: O0

Prf_Man_t * Prf_ManAlloc(void)

{
  Prf_Man_t *pPVar1;
  Vec_Wrd_t *pVVar2;
  Vec_Int_t *pVVar3;
  Prf_Man_t *p;
  
  pPVar1 = (Prf_Man_t *)calloc(1,0x30);
  pPVar1->iFirst = -1;
  pPVar1->iFirst2 = -1;
  pVVar2 = Vec_WrdAlloc(1000);
  pPVar1->vInfo = pVVar2;
  pVVar3 = Vec_IntAlloc(1000);
  pPVar1->vSaved = pVVar3;
  return pPVar1;
}

Assistant:

static inline Prf_Man_t * Prf_ManAlloc()
{
    Prf_Man_t * p;
    p = ABC_CALLOC( Prf_Man_t, 1 );
    p->iFirst  = -1;
    p->iFirst2 = -1;
    p->vInfo   = Vec_WrdAlloc( 1000 );
    p->vSaved  = Vec_IntAlloc( 1000 );
    return p;
}